

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  FieldDescriptor *field;
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint *puVar4;
  long lVar5;
  once_flag *__once;
  Reflection *pRVar6;
  bool bVar7;
  DescriptorPool *pDVar8;
  mapped_type *ppTVar9;
  TypeInfo *type_info;
  DescriptorPool *pDVar10;
  MessageFactory *pMVar11;
  undefined4 extraout_var;
  uint *puVar12;
  uint *puVar13;
  ulong uVar14;
  LogMessage *other;
  long *plVar15;
  DynamicMessage *this_00;
  Reflection *this_01;
  uint uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  Descriptor *pDVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  long *plVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  Descriptor *local_90;
  FieldDescriptor *local_88;
  ulong local_80;
  DynamicMessageFactory *local_78;
  undefined1 local_70 [56];
  int local_38;
  
  local_90 = type;
  if ((this->delegate_to_generated_factory_ == true) &&
     (pDVar10 = *(DescriptorPool **)(*(long *)(type + 0x10) + 0x10),
     pDVar8 = DescriptorPool::generated_pool(), pDVar10 == pDVar8)) {
    pMVar11 = MessageFactory::generated_factory();
    iVar28 = (*pMVar11->_vptr_MessageFactory[2])(pMVar11,type);
    return (Message *)CONCAT44(extraout_var,iVar28);
  }
  ppTVar9 = std::__detail::
            _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->prototypes_,&local_90);
  if (*ppTVar9 == (mapped_type)0x0) {
    type_info = (TypeInfo *)operator_new(0x50);
    pDVar21 = local_90;
    type_info->offsets =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
    type_info->has_bits_indices =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
    type_info->reflection =
         (__uniq_ptr_data<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>,_true,_true>
          )0x0;
    type_info->prototype = (DynamicMessage *)0x0;
    *ppTVar9 = type_info;
    type_info->type = local_90;
    pDVar10 = this->pool_;
    if (pDVar10 == (DescriptorPool *)0x0) {
      pDVar10 = *(DescriptorPool **)(*(long *)(local_90 + 0x10) + 0x10);
    }
    type_info->pool = pDVar10;
    type_info->factory = this;
    if ((long)*(int *)(local_90 + 0x68) < 1) {
      iVar28 = 0;
    }
    else {
      lVar19 = 0;
      iVar28 = 0;
      do {
        uVar26 = 1;
        if (*(int *)(*(long *)(local_90 + 0x30) + 4 + lVar19) == 1) {
          uVar26 = (uint)((*(byte *)(*(long *)(*(long *)(local_90 + 0x30) + 0x20 + lVar19) + 1) & 2)
                         == 0);
        }
        iVar28 = iVar28 + uVar26;
        lVar19 = lVar19 + 0x28;
      } while ((long)*(int *)(local_90 + 0x68) * 0x28 != lVar19);
    }
    uVar22 = 0xffffffffffffffff;
    if (-1 < (int)((long)iVar28 + (long)*(int *)(local_90 + 4))) {
      uVar22 = ((long)iVar28 + (long)*(int *)(local_90 + 4)) * 4;
    }
    local_78 = this;
    puVar12 = (uint *)operator_new__(uVar22);
    puVar13 = (type_info->offsets)._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    (type_info->offsets)._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar12;
    if (puVar13 != (uint *)0x0) {
      operator_delete__(puVar13);
      pDVar21 = local_90;
    }
    type_info->has_bits_offset = -1;
    uVar14 = (ulong)*(uint *)(pDVar21 + 4);
    uVar26 = 0x20;
    uVar22 = 0;
    if ((int)*(uint *)(pDVar21 + 4) < 1) {
      bVar7 = false;
    }
    else {
      lVar19 = 0;
      do {
        lVar18 = *(long *)(pDVar21 + 0x28) + lVar19 * 0x48;
        bVar3 = *(byte *)(lVar18 + 1);
        if ((bVar3 & 2) == 0) {
          if (((bVar3 & 0x60) == 0x20) && (*(char *)(*(long *)(lVar18 + 0x10) + 0x3a) == '\x02')) {
            if (((bVar3 & 0x10) == 0) || (*(long *)(lVar18 + 0x28) == 0)) goto LAB_0038a1b9;
          }
          else if ((bVar3 & 0x60) == 0x40) goto LAB_0038a1b9;
        }
        else {
LAB_0038a1b9:
          if (*(char *)(*(long *)(lVar18 + 0x38) + 0x4f) == '\0') {
            if (type_info->has_bits_offset == -1) {
              type_info->has_bits_offset = 0x20;
              local_80 = uVar22;
              puVar13 = (uint *)operator_new__((long)(int)uVar14 << 2);
              if (0 < *(int *)(pDVar21 + 4)) {
                lVar18 = 0;
                do {
                  puVar13[lVar18] = 0xffffffff;
                  lVar18 = lVar18 + 1;
                } while (lVar18 < *(int *)(pDVar21 + 4));
              }
              puVar4 = (type_info->has_bits_indices)._M_t.
                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
              (type_info->has_bits_indices)._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar13;
              uVar22 = local_80;
              if (puVar4 != (uint *)0x0) {
                operator_delete__(puVar4);
                pDVar21 = local_90;
                uVar22 = local_80;
              }
            }
            (type_info->has_bits_indices)._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar19] = (uint)uVar22;
            uVar22 = (ulong)((uint)uVar22 + 1);
          }
        }
        lVar19 = lVar19 + 1;
        uVar14 = (ulong)*(int *)(pDVar21 + 4);
      } while (lVar19 < (long)uVar14);
      bVar7 = 0 < *(int *)(pDVar21 + 4);
      iVar23 = (int)uVar22;
      if (0 < iVar23) {
        iVar27 = iVar23 + 0x3e;
        if (-1 < iVar23 + 0x1f) {
          iVar27 = iVar23 + 0x1f;
        }
        uVar16 = (iVar27 >> 5) * 4 + 0x27;
        uVar26 = (iVar27 >> 5) * 4 + 0x2e;
        if (-1 < (int)uVar16) {
          uVar26 = uVar16;
        }
        uVar26 = uVar26 & 0xfffffff8;
      }
    }
    if (0 < iVar28) {
      type_info->oneof_case_offset = uVar26;
      uVar16 = uVar26 + iVar28 * 4 + 7;
      uVar26 = uVar26 + iVar28 * 4 + 0xe;
      if (-1 < (int)uVar16) {
        uVar26 = uVar16;
      }
      uVar26 = uVar26 & 0xfffffff8;
    }
    if (*(int *)(pDVar21 + 0x78) < 1) {
      uVar17 = 0xffffffff;
      uVar16 = uVar26;
    }
    else {
      uVar16 = uVar26 + 0x26;
      if (-1 < (int)(uVar26 + 0x1f)) {
        uVar16 = uVar26 + 0x1f;
      }
      uVar16 = uVar16 & 0xfffffff8;
      uVar17 = uVar26;
    }
    type_info->extensions_offset = uVar17;
    if (bVar7) {
      lVar19 = 0;
      lVar18 = 0;
      do {
        lVar5 = *(long *)(pDVar21 + 0x28);
        bVar3 = *(byte *)(lVar5 + 1 + lVar19);
        lVar20 = *(long *)(lVar5 + 0x28 + lVar19);
        if ((lVar20 == 0 || (bVar3 & 0x10) == 0) ||
           ((*(int *)(lVar20 + 4) == 1 && ((*(byte *)(*(long *)(lVar20 + 0x20) + 1) & 2) != 0)))) {
          field = (FieldDescriptor *)(lVar5 + lVar19);
          __once = *(once_flag **)(lVar5 + 0x18 + lVar19);
          if ((~bVar3 & 0x60) == 0) {
            if (__once != (once_flag *)0x0) {
              local_70._0_8_ = FieldDescriptor::TypeOnceInit;
              local_88 = field;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (__once,(_func_void_FieldDescriptor_ptr **)local_70,&local_88);
            }
            iVar27 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)*(byte *)(lVar5 + 2 + lVar19) * 4);
            iVar28 = 8;
            iVar23 = 0x10;
            if (7 < iVar27 - 1U) {
              if (iVar27 == 9) {
                iVar23 = 0x18;
              }
              else {
                if (iVar27 != 10) goto LAB_0038a3fe;
                bVar7 = anon_unknown_0::IsMapFieldInApi(field);
                iVar23 = 0x18;
                if (bVar7) {
                  iVar23 = 0x80;
                }
              }
            }
          }
          else {
            if (__once != (once_flag *)0x0) {
              local_70._0_8_ = FieldDescriptor::TypeOnceInit;
              local_88 = field;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (__once,(_func_void_FieldDescriptor_ptr **)local_70,&local_88);
            }
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                        (ulong)*(byte *)(lVar5 + 2 + lVar19) * 4) - 1U < 10) {
              iVar28 = *(int *)(&DAT_00438420 +
                               (ulong)(*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                               (ulong)*(byte *)(lVar5 + 2 + lVar19) * 4) - 1U) * 4);
              iVar23 = iVar28;
            }
            else {
LAB_0038a3fe:
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_70,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/dynamic_message.cc"
                         ,0xcd);
              other = internal::LogMessage::operator<<((LogMessage *)local_70,"Can\'t get here.");
              internal::LogFinisher::operator=((LogFinisher *)&local_88,other);
              internal::LogMessage::~LogMessage((LogMessage *)local_70);
              iVar28 = 0;
              iVar23 = 0;
            }
          }
          iVar27 = uVar16 + iVar28 + -1;
          uVar16 = iVar27 - iVar27 % iVar28;
          puVar12[lVar18] = uVar16;
          uVar16 = uVar16 + iVar23;
          pDVar21 = local_90;
        }
        lVar18 = lVar18 + 1;
        lVar19 = lVar19 + 0x48;
      } while (lVar18 < *(int *)(pDVar21 + 4));
    }
    iVar28 = *(int *)(pDVar21 + 0x68);
    if (iVar28 < 1) {
      type_info->weak_field_map_offset = -1;
      type_info->size = uVar16;
    }
    else {
      plVar15 = (long *)(*(long *)(pDVar21 + 0x30) + 0x20);
      lVar19 = 0;
      do {
        if ((*(int *)((long)plVar15 + -0x1c) != 1) || ((*(byte *)(*plVar15 + 1) & 2) == 0)) {
          uVar26 = uVar16 + 0xe;
          if (-1 < (int)(uVar16 + 7)) {
            uVar26 = uVar16 + 7;
          }
          puVar12[*(int *)(pDVar21 + 4) + lVar19] = uVar26 & 0xfffffff8;
          uVar16 = (uVar26 & 0xfffffff8) + 8;
          iVar28 = *(int *)(pDVar21 + 0x68);
        }
        lVar19 = lVar19 + 1;
        plVar15 = plVar15 + 5;
      } while (lVar19 < iVar28);
      type_info->weak_field_map_offset = -1;
      type_info->size = uVar16;
      if (0 < iVar28) {
        lVar19 = *(long *)(pDVar21 + 0x30);
        lVar18 = 0;
        do {
          lVar5 = lVar19 + lVar18 * 0x28;
          if (*(int *)(lVar5 + 4) == 1) {
            if ((*(byte *)(*(long *)(lVar5 + 0x20) + 1) & 2) == 0) {
LAB_0038a513:
              lVar20 = *(long *)(lVar5 + 0x20);
              plVar15 = (long *)(lVar20 + 0x28);
              lVar24 = 0;
              do {
                if ((*plVar15 & 0x800) == 0) {
                  plVar25 = (long *)(plVar15[-1] + 0x28);
                }
                else if (*plVar15 == 0) {
                  plVar25 = (long *)(plVar15[-3] + 0x70);
                }
                else {
                  plVar25 = (long *)(*plVar15 + 0x50);
                }
                puVar12[(int)((ulong)(lVar20 - *plVar25) >> 3) * 0x38e38e39] = 0x40000000;
                lVar24 = lVar24 + 1;
                plVar15 = plVar15 + 9;
                lVar20 = lVar20 + 0x48;
              } while (lVar24 < *(int *)(lVar5 + 4));
              iVar28 = *(int *)(pDVar21 + 0x68);
            }
          }
          else if (0 < *(int *)(lVar5 + 4)) goto LAB_0038a513;
          lVar18 = lVar18 + 1;
        } while (lVar18 < iVar28);
      }
    }
    this_00 = (DynamicMessage *)operator_new((long)(int)uVar16);
    memset(this_00,0,(long)(int)uVar16);
    DynamicMessage::DynamicMessage(this_00,type_info,false);
    local_70._0_8_ = type_info->prototype;
    local_70._8_8_ =
         (type_info->offsets)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_70._16_8_ =
         (type_info->has_bits_indices)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_70._24_4_ = type_info->has_bits_offset;
    local_70._28_4_ = 8;
    uVar1 = type_info->oneof_case_offset;
    uVar2 = type_info->extensions_offset;
    local_70._32_8_ = CONCAT44(uVar1,uVar2);
    local_70._40_4_ = type_info->size;
    local_70._44_4_ = type_info->weak_field_map_offset;
    local_70._48_8_ = 0;
    local_38 = 0;
    this_01 = (Reflection *)operator_new(0x60);
    Reflection::Reflection
              (this_01,type_info->type,(ReflectionSchema *)local_70,type_info->pool,
               &local_78->super_MessageFactory);
    pRVar6 = (type_info->reflection)._M_t.
             super___uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_google::protobuf::Reflection_*,_std::default_delete<const_google::protobuf::Reflection>_>
             .super__Head_base<0UL,_const_google::protobuf::Reflection_*,_false>._M_head_impl;
    (type_info->reflection)._M_t.
    super___uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::Reflection_*,_std::default_delete<const_google::protobuf::Reflection>_>
    .super__Head_base<0UL,_const_google::protobuf::Reflection_*,_false>._M_head_impl = this_01;
    if (pRVar6 != (Reflection *)0x0) {
      operator_delete(pRVar6);
    }
    DynamicMessage::CrossLinkPrototypes(this_00);
  }
  else {
    this_00 = (*ppTVar9)->prototype;
  }
  return &this_00->super_Message;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    return MessageFactory::generated_factory()->GetPrototype(type);
  }

  const TypeInfo** target = &prototypes_[type];
  if (*target != nullptr) {
    // Already exists.
    return (*target)->prototype;
  }

  TypeInfo* type_info = new TypeInfo;
  *target = type_info;

  type_info->type = type;
  type_info->pool = (pool_ == nullptr) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.
  int real_oneof_count = 0;
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (!type->oneof_decl(i)->is_synthetic()) {
      real_oneof_count++;
    }
  }

  // Compute size and offsets.
  uint32_t* offsets = new uint32_t[type->field_count() + real_oneof_count];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  type_info->has_bits_offset = -1;
  int max_hasbit = 0;
  for (int i = 0; i < type->field_count(); i++) {
    if (HasHasbit(type->field(i))) {
      if (type_info->has_bits_offset == -1) {
        // At least one field in the message requires a hasbit, so allocate
        // hasbits.
        type_info->has_bits_offset = size;
        uint32_t* has_bits_indices = new uint32_t[type->field_count()];
        for (int j = 0; j < type->field_count(); j++) {
          // Initialize to -1, fields that need a hasbit will overwrite.
          has_bits_indices[j] = static_cast<uint32_t>(-1);
        }
        type_info->has_bits_indices.reset(has_bits_indices);
      }
      type_info->has_bits_indices[i] = max_hasbit++;
    }
  }

  if (max_hasbit > 0) {
    int has_bits_array_size = DivideRoundingUp(max_hasbit, bitsizeof(uint32_t));
    size += has_bits_array_size * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (real_oneof_count > 0) {
    type_info->oneof_case_offset = size;
    size += real_oneof_count * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO(b/31226269):  Optimize the order of fields to minimize padding.
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!InRealOneof(type->field(i))) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (!type->oneof_decl(i)->is_synthetic()) {
      size = AlignTo(size, kSafeAlignment);
      offsets[type->field_count() + i] = size;
      size += kMaxOneofUnionSize;
    }
  }

  type_info->weak_field_map_offset = -1;

  // Align the final size to make sure no clever allocators think that
  // alignment is not necessary.
  type_info->size = size;

  // Construct the reflection object.

  // Compute the size of default oneof instance and offsets of default
  // oneof fields.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (type->oneof_decl(i)->is_synthetic()) continue;
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      // oneof fields are not accessed through offsets, but we still have the
      // entry from a legacy implementation. This should be removed at some
      // point.
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      offsets[field->index()] = internal::kInvalidFieldOffsetTag;
    }
  }

  // Allocate the prototype fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  internal::ReflectionSchema schema = {
      type_info->prototype,
      type_info->offsets.get(),
      type_info->has_bits_indices.get(),
      type_info->has_bits_offset,
      PROTOBUF_FIELD_OFFSET(DynamicMessage, _internal_metadata_),
      type_info->extensions_offset,
      type_info->oneof_case_offset,
      type_info->size,
      type_info->weak_field_map_offset,
      nullptr /* inlined_string_indices_ */,
      0 /* inlined_string_donated_offset_ */};

  type_info->reflection.reset(
      new Reflection(type_info->type, schema, type_info->pool, this));

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}